

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,bool to_array,
          int cached_has_bits_index)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  FieldGenerator *pFVar4;
  char *pcVar5;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar6;
  AlphaNum *a;
  Printer *__s;
  AlphaNum *this_00;
  Hex hex;
  AlphaNum local_80;
  string mask;
  
  bVar2 = *(byte *)(*(long *)(field + 0x80) + 0x6f);
  pFVar6 = field;
  __s = printer;
  if (bVar2 == 0) {
    __s = (Printer *)field;
    anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,field);
    bVar2 = *(byte *)(*(long *)(field + 0x80) + 0x6f);
    pFVar6 = extraout_RDX;
  }
  if ((bVar2 & 1) == 0) {
    iVar1 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c);
    if (*(int *)(field + 0x4c) == 3) {
      if (iVar1 != 3) goto LAB_0028119f;
LAB_002811ea:
      std::__cxx11::string::string((string *)&local_80,"this->",(allocator *)&mask);
      bVar3 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,(string *)&local_80,field);
      std::__cxx11::string::~string((string *)&local_80);
      pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
      (*pFVar4->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar4,printer);
      if (!bVar3) goto LAB_00281333;
    }
    else {
      if (iVar1 == 3) goto LAB_002811ea;
      pcVar5 = FieldDescriptor::index(field,&__s->variable_delimiter_,(int)pFVar6);
      iVar1 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)pcVar5];
      if (iVar1 / 0x20 == cached_has_bits_index) {
        hex.value = 1L << ((byte)iVar1 & 0x1f);
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum(&local_80,hex);
        StrCat_abi_cxx11_(&mask,(protobuf *)&local_80,a);
        io::Printer::Print(printer,"if (cached_has_bits & 0x$mask$u) {\n","mask",&mask);
        this_00 = (AlphaNum *)&mask;
      }
      else {
        FieldName_abi_cxx11_
                  ((string *)&local_80,(cpp *)field,
                   (FieldDescriptor *)((long)iVar1 % 0x20 & 0xffffffff));
        io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)&local_80);
        this_00 = &local_80;
      }
      std::__cxx11::string::~string((string *)this_00);
      io::Printer::Indent(printer);
      pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
      (*pFVar4->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar4,printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  else {
LAB_0028119f:
    pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar4->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar4,printer);
  }
LAB_00281333:
  io::Printer::Print(printer,"\n");
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(
    io::Printer* printer, const FieldDescriptor* field, bool to_array,
    int cached_has_bits_index) {
  if (!field->options().weak()) {
    // For weakfields, PrintFieldComment is called during iteration.
    PrintFieldComment(printer, field);
  }

  bool have_enclosing_if = false;
  if (field->options().weak()) {
  } else if (!field->is_repeated() && HasFieldPresence(descriptor_->file())) {
    // Attempt to use the state of cached_has_bits, if possible.
    int has_bit_index = has_bit_indices_[field->index()];
    if (cached_has_bits_index == has_bit_index / 32) {
      const string mask = StrCat(
          strings::Hex(1u << (has_bit_index % 32),
          strings::ZERO_PAD_8));

      printer->Print(
          "if (cached_has_bits & 0x$mask$u) {\n", "mask", mask);
    } else {
      printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
    }

    printer->Indent();
    have_enclosing_if = true;
  } else if (!HasFieldPresence(descriptor_->file())) {
    have_enclosing_if = EmitFieldNonDefaultCondition(printer, "this->", field);
  }

  if (to_array) {
    field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
        printer);
  } else {
    field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
  }

  if (have_enclosing_if) {
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Print("\n");
}